

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactorTimer.h
# Opt level: O0

void __thiscall
FactorTimer::reportFactorClockList
          (FactorTimer *this,char *grepStamp,HighsTimerClock *factor_timer_clock,
          vector<int,_std::allocator<int>_> *factor_clock_list)

{
  uint uVar1;
  vector<int,_std::allocator<int>_> *this_00;
  size_type sVar2;
  reference pvVar3;
  uint *puVar4;
  vector<int,_std::allocator<int>_> *in_RCX;
  vector<int,_std::allocator<int>_> *__nbytes;
  undefined8 *in_RDX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  double in_stack_00000058;
  double ideal_sum_time;
  HighsInt en;
  char *in_stack_00000070;
  vector<int,_std::allocator<int>_> clockList;
  HighsInt factor_clock_list_size;
  vector<int,_std::allocator<int>_> *clock;
  HighsTimer *timer_pointer;
  HighsTimer *this_01;
  size_type in_stack_ffffffffffffff58;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff60;
  HighsTimer *pHVar5;
  int local_60;
  vector<int,_std::allocator<int>_> local_50;
  int local_34;
  vector<int,_std::allocator<int>_> *local_30;
  HighsTimer *local_28;
  
  local_28 = (HighsTimer *)*in_RDX;
  local_30 = (vector<int,_std::allocator<int>_> *)(in_RDX + 1);
  __nbytes = in_RCX;
  sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RCX);
  local_34 = (int)sVar2;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x7b96ab);
  std::vector<int,_std::allocator<int>_>::resize
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  for (local_60 = 0; this_00 = local_30, local_60 < local_34; local_60 = local_60 + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RCX,(long)local_60);
    puVar4 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)*pvVar3);
    uVar1 = *puVar4;
    puVar4 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](&local_50,(long)local_60);
    __nbytes = (vector<int,_std::allocator<int>_> *)(ulong)uVar1;
    *puVar4 = uVar1;
  }
  pHVar5 = local_28;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_30,0);
  HighsTimer::read(pHVar5,*pvVar3,__buf,(size_t)__nbytes);
  this_01 = local_28;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_30,5);
  HighsTimer::read(this_01,*pvVar3,__buf_00,(size_t)__nbytes);
  pHVar5 = local_28;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_30,0x19);
  HighsTimer::read(pHVar5,*pvVar3,__buf_01,(size_t)__nbytes);
  HighsTimer::reportOnTolerance
            ((HighsTimer *)
             clockList.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,in_stack_00000070,_en,ideal_sum_time,in_stack_00000058);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_01);
  return;
}

Assistant:

void reportFactorClockList(const char* grepStamp,
                             HighsTimerClock& factor_timer_clock,
                             std::vector<HighsInt> factor_clock_list) {
    HighsTimer* timer_pointer = factor_timer_clock.timer_pointer_;
    std::vector<HighsInt>& clock = factor_timer_clock.clock_;
    HighsInt factor_clock_list_size = factor_clock_list.size();
    std::vector<HighsInt> clockList;
    clockList.resize(factor_clock_list_size);
    for (HighsInt en = 0; en < factor_clock_list_size; en++) {
      clockList[en] = clock[factor_clock_list[en]];
    }
    double ideal_sum_time = 0;
    ideal_sum_time += timer_pointer->read(clock[FactorInvert]);
    ideal_sum_time += timer_pointer->read(clock[FactorFtran]);
    ideal_sum_time += timer_pointer->read(clock[FactorBtran]);
    timer_pointer->reportOnTolerance(grepStamp, clockList, ideal_sum_time,
                                     1e-8);
  }